

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O2

void Image_Function::ReplaceChannel
               (Image *channel,uint32_t startXChannel,uint32_t startYChannel,Image *rgb,
               uint32_t startXRgb,uint32_t startYRgb,uint32_t width,uint32_t height,
               uint8_t channelId)

{
  uchar uVar1;
  uint uVar2;
  uint uVar3;
  imageException *this;
  uchar *puVar4;
  uchar *puVar5;
  ulong uVar6;
  uchar *puVar7;
  uchar *puVar8;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (channel,startXChannel,startYChannel,rgb,startXRgb,startYRgb,width,height);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(channel);
  VerifyRGBImage<PenguinV_Image::ImageTemplate<unsigned_char>>(rgb);
  if (channelId < 3) {
    uVar2 = rgb->_rowSize;
    uVar3 = channel->_rowSize;
    puVar5 = rgb->_data + (ulong)channelId + (ulong)(startXRgb * 3) + (ulong)(startYRgb * uVar2);
    puVar4 = channel->_data + (ulong)startXChannel + (ulong)(startYChannel * uVar3);
    puVar8 = puVar5 + height * uVar2;
    for (; puVar5 != puVar8; puVar5 = puVar5 + uVar2) {
      puVar7 = puVar4;
      for (uVar6 = 0; width * 3 != uVar6; uVar6 = uVar6 + 3) {
        uVar1 = *puVar7;
        puVar7 = puVar7 + 1;
        puVar5[uVar6] = uVar1;
      }
      puVar4 = puVar4 + uVar3;
    }
    return;
  }
  this = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this,"Channel ID is greater than number of channels in RGB image");
  __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void ReplaceChannel( const Image & channel, uint32_t startXChannel, uint32_t startYChannel, Image & rgb, uint32_t startXRgb, uint32_t startYRgb,
                         uint32_t width, uint32_t height, uint8_t channelId )
    {
        ParameterValidation( channel, startXChannel, startYChannel, rgb, startXRgb, startYRgb, width, height );
        VerifyGrayScaleImage( channel );
        VerifyRGBImage( rgb );

        if ( channelId >= RGB )
            throw imageException( "Channel ID is greater than number of channels in RGB image" );

        const uint32_t rowSizeIn  = channel.rowSize();
        const uint32_t rowSizeOut = rgb.rowSize();

        const uint8_t colorCount = RGB;

        const uint8_t * inY  = channel.data() + startYChannel * rowSizeIn  + startXChannel;
        uint8_t       * outY = rgb.data() + startYRgb * rowSizeOut + startXRgb * colorCount + channelId;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        width = width * colorCount;

        for ( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const uint8_t * inX  = inY;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + width;

            for ( ; outX != outXEnd; outX += colorCount, ++inX )
                *outX = *inX;
        }
    }